

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost2001cp_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *in_RSI;
  EC_KEY *ec;
  EVP_PKEY *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  iVar1 = pkey_gost2001_paramgen((EVP_PKEY_CTX *)in_RSI,in_stack_ffffffffffffffe0);
  if (iVar1 != 0) {
    EVP_PKEY_get0(in_RSI);
    gost_ec_keygen(ec);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int pkey_gost2001cp_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey)
{
    EC_KEY *ec;
    if (!pkey_gost2001_paramgen(ctx, pkey))
        return 0;
    ec = EVP_PKEY_get0(pkey);
    gost_ec_keygen(ec);
    return 1;
}